

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivImprove(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int iVar3;
  Vec_Int_t *p_01;
  int *piVar4;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint local_40;
  int local_3c;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs != NULL && p->pNexts != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x6bc,"void Gia_ManEquivImprove(Gia_Man_t *)");
  }
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_01->pArray = piVar4;
  if (1 < p->nObjs) {
    uVar10 = 1;
    uVar5 = extraout_RDX;
    do {
      if ((((uint)p->pReprs[uVar10] & 0xfffffff) == 0xfffffff) && (0 < p->pNexts[uVar10])) {
        p_01->nSize = 0;
        if (p->pNexts[uVar10] < 1) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x6c6,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        local_40 = 0xffffffff;
        local_3c = 1000000000;
        iVar8 = 1000000000;
        uVar7 = uVar10;
        do {
          uVar9 = (uint)uVar7;
          if (p->nObjs <= (int)uVar9) {
LAB_00202cd5:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          p_00 = p->vLevels;
          Vec_IntFillExtra(p_00,uVar9 + 1,(int)uVar5);
          if (p_00->nSize <= (int)uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->nObjs <= (int)uVar9) goto LAB_00202cd5;
          uVar6 = uVar7 & 0xffffffff;
          iVar1 = p_00->pArray[uVar6];
          iVar3 = Gia_NodeMffcSize(p,p->pObjs + uVar6);
          if ((iVar1 < iVar8) || ((iVar8 == iVar1 && (iVar3 < local_3c)))) {
            iVar8 = iVar1;
            local_40 = uVar9;
            local_3c = iVar3;
          }
          Vec_IntPush(p_01,uVar9);
          uVar7 = (ulong)(uint)p->pNexts[uVar6];
          uVar5 = extraout_RDX_00;
        } while (0 < p->pNexts[uVar6]);
        uVar9 = p_01->nSize;
        if ((int)uVar9 < 2) {
          __assert_fail("Vec_IntSize( vClass ) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x6d2,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        if ((int)local_40 < 1) {
          __assert_fail("iReprBest > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x6d3,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        uVar7 = (ulong)local_40;
        if (uVar10 != uVar7) {
          p->pReprs[uVar7] = (Gia_Rpr_t)((uint)p->pReprs[uVar7] | 0xfffffff);
          p->pReprs[uVar10] = (Gia_Rpr_t)((uint)p->pReprs[uVar10] | 0x10000000);
          p->pReprs[uVar7] = (Gia_Rpr_t)((uint)p->pReprs[uVar7] & 0xefffffff);
          piVar4 = p_01->pArray;
          uVar5 = (ulong)(local_40 & 0xfffffff);
          uVar7 = 0;
          do {
            uVar2 = piVar4[uVar7];
            if (uVar2 != local_40) {
              if ((local_40 != 0xfffffff) && ((int)uVar2 <= (int)local_40)) {
                __assert_fail("Num == GIA_VOID || Num < Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
              }
              p->pReprs[(int)uVar2] =
                   (Gia_Rpr_t)((uint)p->pReprs[(int)uVar2] & 0xf0000000 | local_40 & 0xfffffff);
            }
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)p->nObjs);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManEquivImprove( Gia_Man_t * p )
{
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr;
    int iReprBest, iLevelBest, iLevelCur, iMffcBest, iMffcCur;
    assert( p->pReprs != NULL && p->pNexts != NULL );
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        iReprBest = -1;
        iLevelBest = iMffcBest = ABC_INFINITY;
        Gia_ClassForEachObj( p, i, k )
        {
            iLevelCur = Gia_ObjLevel( p,Gia_ManObj(p, k) );
            iMffcCur  = Gia_NodeMffcSize( p, Gia_ManObj(p, k) );
            if ( iLevelBest > iLevelCur || (iLevelBest == iLevelCur && iMffcBest > iMffcCur) )
            {
                iReprBest  = k;
                iLevelBest = iLevelCur;
                iMffcBest  = iMffcCur;
            }
            Vec_IntPush( vClass, k );
        }
        assert( Vec_IntSize( vClass ) > 1 );
        assert( iReprBest > 0 );
        if ( i == iReprBest )
            continue;
/*
        Abc_Print( 1, "Repr/Best = %6d/%6d. Lev = %3d/%3d. Mffc = %3d/%3d.\n", 
            i, iReprBest, Gia_ObjLevel( p,Gia_ManObj(p, i) ), Gia_ObjLevel( p,Gia_ManObj(p, iReprBest) ),
            Gia_NodeMffcSize( p, Gia_ManObj(p, i) ), Gia_NodeMffcSize( p, Gia_ManObj(p, iReprBest) ) );
*/
        iRepr = iReprBest;
        Gia_ObjSetRepr( p, iRepr, GIA_VOID );
        Gia_ObjSetProved( p, i );
        Gia_ObjUnsetProved( p, iRepr );
        Vec_IntForEachEntry( vClass, iNode, k )
            if ( iNode != iRepr )
                Gia_ObjSetRepr( p, iNode, iRepr );
    }
    Vec_IntFree( vClass );
    ABC_FREE( p->pNexts );
//    p->pNexts = Gia_ManDeriveNexts( p );
}